

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

bool FastPForLib::Simple16<false>::trymefull<1u,3u,4u,4u,3u,3u>(uint32_t *n)

{
  bool bVar1;
  uint32_t i_2;
  uint32_t min3;
  uint32_t i_1;
  uint32_t min2;
  uint32_t i;
  uint32_t min1;
  uint32_t *n_local;
  
  bVar1 = false;
  while (!bVar1) {
    if (7 < *n) {
      return false;
    }
    bVar1 = true;
  }
  for (i_1 = 1; i_1 < 5; i_1 = i_1 + 1) {
    if (0xf < n[i_1]) {
      return false;
    }
  }
  i_2 = 5;
  while( true ) {
    if (7 < i_2) {
      return true;
    }
    if (7 < n[i_2]) break;
    i_2 = i_2 + 1;
  }
  return false;
}

Assistant:

__attribute__((pure)) static bool trymefull(const uint32_t *n) {
    const uint32_t min1 = num1;
    for (uint32_t i = 0; i < min1; i++) {
      if (n[i] >= (1U << log1))
        return false;
    }
    const uint32_t min2 = num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if (n[i] >= (1U << log2))
        return false;
    }
    const uint32_t min3 = num3;
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if (n[i] >= (1U << log3))
        return false;
    }
    return true;
  }